

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  bin_writer<1> f;
  string_view prefix;
  int iVar3;
  char *in_RDI;
  string_view sVar4;
  size_t unaff_retaddr;
  format_specs in_stack_00000010;
  int num_digits;
  unsigned_type in_stack_fffffffffffffff0;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x14] = '0';
    cVar1 = *(char *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x14] = cVar1;
  }
  iVar3 = count_digits<1u,unsigned_int>(*(uint *)(in_RDI + 0x10));
  sVar4 = get_prefix((int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1c0a54);
  prefix.size_ = unaff_retaddr;
  prefix.data_ = in_RDI;
  f.num_digits = iVar3;
  f.abs_value = in_stack_fffffffffffffff0;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar4.size_,sVar4.data_._4_4_,prefix,
             in_stack_00000010,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }